

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::Reset(cmRST *this)

{
  bool bVar1;
  cmRST *this_local;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->MarkupLines);
  if (!bVar1) {
    UnindentLines(&this->MarkupLines);
  }
  switch(this->Directive) {
  case DirectiveNone:
    break;
  case DirectiveParsedLiteral:
    ProcessDirectiveParsedLiteral(this);
    break;
  case DirectiveLiteralBlock:
    ProcessDirectiveLiteralBlock(this);
    break;
  case DirectiveCodeBlock:
    ProcessDirectiveCodeBlock(this);
    break;
  case DirectiveReplace:
    ProcessDirectiveReplace(this);
    break;
  case DirectiveTocTree:
    ProcessDirectiveTocTree(this);
  }
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->MarkupLines);
  return;
}

Assistant:

void cmRST::Reset()
{
  if (!this->MarkupLines.empty()) {
    cmRST::UnindentLines(this->MarkupLines);
  }
  switch (this->Directive) {
    case DirectiveNone:
      break;
    case DirectiveParsedLiteral:
      this->ProcessDirectiveParsedLiteral();
      break;
    case DirectiveLiteralBlock:
      this->ProcessDirectiveLiteralBlock();
      break;
    case DirectiveCodeBlock:
      this->ProcessDirectiveCodeBlock();
      break;
    case DirectiveReplace:
      this->ProcessDirectiveReplace();
      break;
    case DirectiveTocTree:
      this->ProcessDirectiveTocTree();
      break;
  }
  this->Markup = MarkupNone;
  this->Directive = DirectiveNone;
  this->MarkupLines.clear();
}